

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timestep_embedding.cpp
# Opt level: O0

void set_timestep_embedding(ggml_tensor *timesteps,ggml_tensor *embedding,int dim,int max_period)

{
  reference pvVar1;
  int in_EDX;
  ggml_tensor *in_RSI;
  long in_RDI;
  float fVar2;
  float fVar3;
  __type _Var4;
  double dVar5;
  float arg;
  int j;
  int i_1;
  int i;
  vector<float,_std::allocator<float>_> freqs;
  int half;
  int in_stack_ffffffffffffff5c;
  ggml_tensor *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  ggml_tensor *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int local_58;
  int local_54;
  int local_50;
  vector<float,_std::allocator<float>_> local_38;
  int local_1c;
  int local_14;
  ggml_tensor *local_10;
  long local_8;
  
  local_1c = in_EDX / 2;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<float>::allocator((allocator<float> *)0x103508);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             (allocator_type *)in_stack_ffffffffffffff70);
  std::allocator<float>::~allocator((allocator<float> *)0x103528);
  for (local_50 = 0; local_50 < local_1c; local_50 = local_50 + 1) {
    _Var4 = std::log<int>(0);
    dVar5 = exp((-_Var4 * (double)local_50) / (double)local_1c);
    fVar2 = (float)dVar5;
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_50);
    *pvVar1 = fVar2;
  }
  for (local_54 = 0; (long)local_54 < *(long *)(local_8 + 0x10); local_54 = local_54 + 1) {
    for (local_58 = 0; local_58 < local_1c; local_58 = local_58 + 1) {
      fVar3 = (float)ggml_get_f32_1d(local_8,local_54);
      pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](&local_38,(long)local_58);
      fVar2 = *pvVar1;
      in_stack_ffffffffffffff70 = local_10;
      std::cos((double)(ulong)(uint)(fVar3 * fVar2));
      ggml_tensor_set_f32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          (int)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      in_stack_ffffffffffffff60 = local_10;
      dVar5 = std::sin((double)(ulong)(uint)(fVar3 * fVar2));
      in_stack_ffffffffffffff6c = SUB84(dVar5,0);
      ggml_tensor_set_f32(in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                          in_stack_ffffffffffffff68,(int)((ulong)in_stack_ffffffffffffff60 >> 0x20),
                          (int)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    }
    if (local_14 % 2 != 0) {
      *(undefined4 *)
       ((long)local_10->data + (long)local_14 * local_10->nb[0] + (long)local_54 * local_10->nb[1])
           = 0;
    }
  }
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

void set_timestep_embedding(struct ggml_tensor* timesteps, struct ggml_tensor* embedding, int dim, int max_period = 10000) {
    // timesteps: [N,]
    // embedding: [dim, N]
    int half = dim / 2;
    std::vector<float> freqs(half);
    for (int i = 0; i < half; ++i) {
        freqs[i] = (float)std::exp(-std::log(max_period) * i / half);
    }
    for (int i = 0; i < timesteps->ne[0]; ++i) {
        for (int j = 0; j < half; ++j) {
            float arg = ggml_get_f32_1d(timesteps, i) * freqs[j];
            ggml_tensor_set_f32(embedding, std::cos(arg), j, i);
            ggml_tensor_set_f32(embedding, std::sin(arg), j + half, i);
        }
        if (dim % 2 != 0) {
            *(float*)((char*)embedding->data + i * embedding->nb[1] + dim * embedding->nb[0]) = 0;
        }
    }
}